

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

LY_ERR lyd_find_sibling_dup_inst_set(lyd_node *siblings,lyd_node *target,ly_set **set)

{
  ly_ctx *plVar1;
  lyd_node_inner *plVar2;
  LY_ERR LVar3;
  uint uVar4;
  uint32_t options;
  LY_ERR LVar5;
  lysc_node *plVar6;
  lysc_node *plVar7;
  lyd_node *node2;
  lys_module *plVar8;
  lys_module *plVar9;
  char *pcVar10;
  lyd_node **match_p;
  lyd_node *first;
  lyd_node *local_50;
  long *local_48;
  lyd_node *local_40;
  lyd_node *local_38;
  
  local_40 = target;
  if (target == (lyd_node *)0x0) {
    pcVar10 = "target";
LAB_00123c18:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar10,
           "lyd_find_sibling_dup_inst_set");
    return LY_EINVAL;
  }
  if (set == (ly_set **)0x0) {
    pcVar10 = "set";
    goto LAB_00123c18;
  }
  if (siblings != (lyd_node *)0x0) {
    plVar6 = siblings->schema;
    if (plVar6 == (lysc_node *)0x0) {
      plVar1 = (ly_ctx *)siblings[2].schema;
    }
    else {
      plVar1 = plVar6->module->ctx;
    }
    if (plVar1 != (ly_ctx *)0x0) {
      plVar7 = target->schema;
      if (plVar7 == (lysc_node *)0x0) {
        plVar1 = (ly_ctx *)target[2].schema;
      }
      else {
        plVar1 = plVar7->module->ctx;
      }
      if (plVar1 != (ly_ctx *)0x0) {
        if (plVar6 == (lysc_node *)0x0) {
          plVar9 = (lys_module *)&siblings[2].schema;
        }
        else {
          plVar9 = plVar6->module;
        }
        if (plVar7 == (lysc_node *)0x0) {
          plVar8 = (lys_module *)&target[2].schema;
        }
        else {
          plVar8 = plVar7->module;
        }
        if (plVar9->ctx != plVar8->ctx) {
          if (plVar6 == (lysc_node *)0x0) {
            plVar9 = (lys_module *)&siblings[2].schema;
          }
          else {
            plVar9 = plVar6->module;
          }
          ly_log(plVar9->ctx,LY_LLERR,LY_EINVAL,
                 "Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
    }
  }
  LVar3 = ly_set_new(set);
  LVar5 = LY_ENOTFOUND;
  if (LVar3 != LY_SUCCESS) {
    LVar5 = LVar3;
  }
  if (LVar3 != LY_SUCCESS || siblings == (lyd_node *)0x0) {
    return LVar5;
  }
  if (siblings->schema != (lysc_node *)0x0) {
    plVar6 = lysc_data_node(siblings->schema->parent);
    if (target->schema == (lysc_node *)0x0) {
      plVar7 = (lysc_node *)0x0;
    }
    else {
      plVar7 = target->schema->parent;
    }
    plVar7 = lysc_data_node(plVar7);
    if (plVar6 != plVar7) {
      return LY_ENOTFOUND;
    }
  }
  plVar6 = target->schema;
  if (plVar6 == (lysc_node *)0x0) {
LAB_00123d15:
    options = 0;
  }
  else {
    if (plVar6->nodetype == 8) {
      uVar4 = ~(uint)plVar6->flags;
    }
    else {
      if (plVar6->nodetype != 0x10) goto LAB_00123d15;
      uVar4 = (uint)(plVar6->flags >> 9);
    }
    options = uVar4 & 1;
  }
  node2 = lyd_first_sibling(siblings);
  plVar2 = node2->parent;
  if (((plVar2 == (lyd_node_inner *)0x0) || ((plVar2->field_0).node.schema == (lysc_node *)0x0)) ||
     (plVar2->children_ht == (ly_ht *)0x0)) {
    do {
      LVar5 = lyd_compare_single(target,node2,options);
      if (LVar5 == LY_SUCCESS) {
        ly_set_add(*set,node2,'\x01',(uint32_t *)0x0);
      }
      node2 = node2->next;
    } while (node2 != (lyd_node *)0x0);
  }
  else {
    if (target->hash == 0) {
      __assert_fail("target->hash",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                    ,0xc88,
                    "LY_ERR lyd_find_sibling_dup_inst_set(const struct lyd_node *, const struct lyd_node *, struct ly_set **)"
                   );
    }
    lyd_find_sibling_first(node2,target,&local_38);
    if (local_38 != (lyd_node *)0x0) {
      LVar5 = ly_set_add(*set,local_38,'\x01',(uint32_t *)0x0);
      if (LVar5 != LY_SUCCESS) {
LAB_00123dad:
        ly_set_free(*set,(_func_void_void_ptr *)0x0);
        *set = (ly_set *)0x0;
        return LY_EMEM;
      }
      LVar5 = lyht_find(plVar2->children_ht,&local_40,target->hash,&local_48);
      if ((LVar5 == LY_SUCCESS) && (local_50 = (lyd_node *)*local_48, local_50 != (lyd_node *)0x0))
      {
        do {
          if (((local_50 != local_38) &&
              (LVar5 = lyd_compare_single(local_50,local_40,options), LVar5 == LY_SUCCESS)) &&
             (LVar5 = ly_set_add(*set,local_50,'\x01',(uint32_t *)0x0), LVar5 != LY_SUCCESS))
          goto LAB_00123dad;
          LVar5 = lyht_find_next(plVar2->children_ht,&local_50,local_50->hash,&local_48);
        } while ((LVar5 == LY_SUCCESS) &&
                (local_50 = (lyd_node *)*local_48, local_50 != (lyd_node *)0x0));
      }
    }
  }
  return (uint)((*set)->count == 0) * 5;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_find_sibling_dup_inst_set(const struct lyd_node *siblings, const struct lyd_node *target, struct ly_set **set)
{
    struct lyd_node **match_p, *first, *iter;
    struct lyd_node_inner *parent;
    uint32_t comp_opts;

    LY_CHECK_ARG_RET(NULL, target, set, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(siblings ? LYD_CTX(siblings) : NULL, LYD_CTX(target), LY_EINVAL);

    LY_CHECK_RET(ly_set_new(set));

    if (!siblings || (siblings->schema && (lysc_data_parent(siblings->schema) != lysc_data_parent(target->schema)))) {
        /* no data or schema mismatch */
        return LY_ENOTFOUND;
    }

    /* set options */
    comp_opts = (lysc_is_dup_inst_list(target->schema) ? LYD_COMPARE_FULL_RECURSION : 0);

    /* get first sibling */
    siblings = lyd_first_sibling(siblings);

    parent = siblings->parent;
    if (parent && parent->schema && parent->children_ht) {
        assert(target->hash);

        /* find the first instance */
        lyd_find_sibling_first(siblings, target, &first);
        if (first) {
            /* add it so that it is the first in the set */
            if (ly_set_add(*set, first, 1, NULL)) {
                goto error;
            }

            /* find by hash */
            if (!lyht_find(parent->children_ht, &target, target->hash, (void **)&match_p)) {
                iter = *match_p;
            } else {
                /* not found */
                iter = NULL;
            }
            while (iter) {
                /* add all found nodes into the set */
                if ((iter != first) && !lyd_compare_single(iter, target, comp_opts) && ly_set_add(*set, iter, 1, NULL)) {
                    goto error;
                }

                /* find next instance */
                if (lyht_find_next(parent->children_ht, &iter, iter->hash, (void **)&match_p)) {
                    iter = NULL;
                } else {
                    iter = *match_p;
                }
            }
        }
    } else {
        /* no children hash table */
        LY_LIST_FOR(siblings, siblings) {
            if (!lyd_compare_single(target, siblings, comp_opts)) {
                ly_set_add(*set, (void *)siblings, 1, NULL);
            }
        }
    }

    if (!(*set)->count) {
        return LY_ENOTFOUND;
    }
    return LY_SUCCESS;

error:
    ly_set_free(*set, NULL);
    *set = NULL;
    return LY_EMEM;
}